

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O0

void printTypedVectorList
               (MCInst *MI,uint OpNum,SStream *O,uint NumLanes,char LaneKind,MCRegisterInfo *MRI)

{
  uint in_ECX;
  char in_R8B;
  undefined8 in_R9;
  arm64_vess vess;
  arm64_vas vas;
  char Suffix [32];
  char local_48 [4];
  arm64_vas in_stack_ffffffffffffffbc;
  MCRegisterInfo *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  SStream *in_stack_ffffffffffffffd0;
  uint OpNum_00;
  undefined3 in_stack_ffffffffffffffe0;
  undefined4 uVar1;
  arm64_vess in_stack_fffffffffffffff0;
  
  OpNum_00 = (uint)((ulong)in_R9 >> 0x20);
  uVar1 = CONCAT13(in_R8B,in_stack_ffffffffffffffe0);
  if (in_ECX == 0) {
    cs_snprintf(local_48,0x20,".%c",(ulong)(uint)(int)in_R8B);
    switch((char)((uint)uVar1 >> 0x18)) {
    case 'b':
      break;
    default:
      break;
    case 'd':
      break;
    case 'h':
      break;
    case 's':
    }
  }
  else {
    cs_snprintf(local_48,0x20,".%u%c",(ulong)in_ECX,(ulong)(uint)(int)in_R8B);
    switch((char)((uint)uVar1 >> 0x18)) {
    case 'b':
      break;
    default:
      break;
    case 'd':
      break;
    case 'h':
      break;
    case 'q':
      break;
    case 's':
    }
  }
  printVectorList((MCInst *)CONCAT44(in_ECX,uVar1),OpNum_00,in_stack_ffffffffffffffd0,
                  in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                  in_stack_fffffffffffffff0);
  return;
}

Assistant:

static void printTypedVectorList(MCInst *MI, unsigned OpNum, SStream *O, unsigned NumLanes, char LaneKind, MCRegisterInfo *MRI)
{
	char Suffix[32];
	arm64_vas vas = 0;
	arm64_vess vess = 0;

	if (NumLanes) {
		cs_snprintf(Suffix, sizeof(Suffix), ".%u%c", NumLanes, LaneKind);
		switch(LaneKind) {
			default: break;
			case 'b':
				switch(NumLanes) {
					default: break;
					case 8:
							 vas = ARM64_VAS_8B;
							 break;
					case 16:
							 vas = ARM64_VAS_16B;
							 break;
				}
				break;
			case 'h':
				switch(NumLanes) {
					default: break;
					case 4:
							 vas = ARM64_VAS_4H;
							 break;
					case 8:
							 vas = ARM64_VAS_8H;
							 break;
				}
				break;
			case 's':
				switch(NumLanes) {
					default: break;
					case 2:
							 vas = ARM64_VAS_2S;
							 break;
					case 4:
							 vas = ARM64_VAS_4S;
							 break;
				}
				break;
			case 'd':
				switch(NumLanes) {
					default: break;
					case 1:
							 vas = ARM64_VAS_1D;
							 break;
					case 2:
							 vas = ARM64_VAS_2D;
							 break;
				}
				break;
			case 'q':
				switch(NumLanes) {
					default: break;
					case 1:
							 vas = ARM64_VAS_1Q;
							 break;
				}
				break;
		}
	} else {
		cs_snprintf(Suffix, sizeof(Suffix), ".%c", LaneKind);
		switch(LaneKind) {
			default: break;
			case 'b':
					 vess = ARM64_VESS_B;
					 break;
			case 'h':
					 vess = ARM64_VESS_H;
					 break;
			case 's':
					 vess = ARM64_VESS_S;
					 break;
			case 'd':
					 vess = ARM64_VESS_D;
					 break;
		}
	}

	printVectorList(MI, OpNum, O, Suffix, MRI, vas, vess);
}